

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PointCase::init(PointCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLfloat pointSizeRange [2];
  string local_48;
  undefined8 local_28;
  
  iVar2 = (*((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  fVar1 = this->m_pointSize;
  local_28 = 0;
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x818))(0x846d,&local_28);
  if (fVar1 <= local_28._4_4_) {
    return iVar2;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Maximum point size is too low for this test","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PointCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	checkPointSize (gl, m_pointSize);
}